

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::cose::Sign1Message::AddAttribute
          (Error *__return_storage_ptr__,Sign1Message *this,int key,int value,int flags)

{
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view fmt;
  ErrorCode local_16c;
  Error local_168;
  anon_class_1_0_00000001 local_13a;
  v10 local_139;
  v10 *local_138;
  size_t local_130;
  string local_128;
  Error local_108;
  cn_cbor *local_d0;
  cn_cbor *cbor;
  int local_c0;
  int flags_local;
  int value_local;
  int key_local;
  Sign1Message *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  cbor._3_1_ = 0;
  cbor._4_4_ = flags;
  local_c0 = value;
  flags_local = key;
  _value_local = this;
  this_local = (Sign1Message *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  local_d0 = cn_cbor_int_create((long)local_c0,(cn_cbor_errback *)0x0);
  if (local_d0 == (cn_cbor *)0x0) {
    AddAttribute::anon_class_1_0_00000001::operator()(&local_13a);
    local_58 = &local_138;
    local_60 = &local_139;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_130 = bVar1.size_;
    local_138 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_128;
    local_78 = local_138;
    sStack_70 = local_130;
    local_50 = &local_78;
    local_88 = local_138;
    local_80 = local_130;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_128,local_88,fmt,args);
    Error::Error(&local_108,kOutOfMemory,&local_128);
    Error::operator=(__return_storage_ptr__,&local_108);
    Error::~Error(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  else {
    AddAttribute(&local_168,this,flags_local,local_d0,cbor._4_4_);
    aError = Error::operator=(__return_storage_ptr__,&local_168);
    local_16c = kNone;
    commissioner::operator!=(aError,&local_16c);
    Error::~Error(&local_168);
  }
  if ((local_d0 != (cn_cbor *)0x0) && (local_d0->parent == (cn_cbor *)0x0)) {
    cn_cbor_free(local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::AddAttribute(int key, int value, int flags)
{
    Error    error;
    cn_cbor *cbor;

    cbor = cn_cbor_int_create(value, nullptr);
    VerifyOrExit(cbor != nullptr, error = ERROR_OUT_OF_MEMORY("add COSE SIGN1 message attribute"));

    SuccessOrExit(error = AddAttribute(key, cbor, flags));

exit:
    if (cbor != nullptr && cbor->parent == nullptr)
    {
        cn_cbor_free(cbor);
    }
    return error;
}